

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_ImportCall
              (JavascriptFunction *function,Var specifier,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  ModuleID moduleId;
  JavascriptString *pJVar5;
  Utf8SourceInfo *pUVar6;
  JavascriptLibrary *pJVar7;
  JavascriptError *pJVar8;
  Var pvVar9;
  SourceContextInfo *pSVar10;
  undefined4 extraout_var;
  ScriptContext *this;
  undefined4 *puVar11;
  ThreadContext *pTVar12;
  HostScriptContext *pHVar13;
  Recycler *pRVar14;
  SourceTextModuleRecord *pSVar15;
  undefined4 extraout_var_00;
  bool local_29a;
  JavascriptError *error_2;
  TrackAllocData local_218;
  char16_t *local_1f0;
  char16 *allocatedString;
  size_t length;
  undefined1 local_1d8 [2];
  OutOfMemoryException anon_var_0_5;
  StackOverflowException anon_var_0_6;
  NotImplementedException anon_var_0_7;
  ScriptAbortException anon_var_0_8;
  AsmJsParseException anon_var_0_9;
  AutoHandledExceptionType __autoHandledExceptionType_1;
  AutoReentrancyHandler autoReentrancyHandler_1;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject_1;
  void *__frameAddr_1;
  undefined1 local_190 [2];
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  AutoHandledExceptionType __autoHandledExceptionType;
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  SourceTextModuleRecord *referenceModuleRecord;
  HRESULT hr;
  LPCOLESTR moduleName;
  JavascriptError *error_1;
  JavascriptStackWalker walker;
  JavascriptFunction *caller;
  JavascriptError *error;
  DWORD_PTR dwReferencingSourceContext;
  Var errorObject;
  JavascriptException *err;
  JavascriptString *specifierString;
  FunctionBody *parentFuncBody;
  SourceTextModuleRecord *moduleRecord;
  ModuleRecordBase *moduleRecordBase;
  ScriptContext *scriptContext_local;
  Var specifier_local;
  JavascriptFunction *function_local;
  char16_t *string;
  
  moduleRecord = (SourceTextModuleRecord *)0x0;
  moduleRecordBase = (ModuleRecordBase *)scriptContext;
  scriptContext_local = (ScriptContext *)specifier;
  specifier_local = function;
  specifierString = (JavascriptString *)JavascriptFunction::GetFunctionBody(function);
  pJVar5 = JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)moduleRecordBase);
  error = (JavascriptError *)FunctionProxy::GetHostSourceContext((FunctionProxy *)specifierString);
  bVar2 = ParseableFunctionInfo::IsES6ModuleCode((ParseableFunctionInfo *)specifierString);
  if ((!bVar2) && (error == (JavascriptError *)&DAT_ffffffffffffffff)) {
    pUVar6 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)specifierString);
    pUVar6 = Utf8SourceInfo::GetCallerUtf8SourceInfo(pUVar6);
    if (pUVar6 == (Utf8SourceInfo *)0x0) {
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)moduleRecordBase);
      pJVar8 = JavascriptLibrary::CreateError(pJVar7);
      JavascriptError::SetErrorMessageProperties
                (pJVar8,-0x7fffbffb,L"Unable to locate active script or module that calls import()",
                 (ScriptContext *)moduleRecordBase);
      pvVar9 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                         (false,pJVar8,(ScriptContext *)moduleRecordBase,
                          (SourceTextModuleRecord *)0x0,true);
      return pvVar9;
    }
    pUVar6 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)specifierString);
    pUVar6 = Utf8SourceInfo::GetCallerUtf8SourceInfo(pUVar6);
    pSVar10 = Utf8SourceInfo::GetSourceContextInfo(pUVar6);
    error = (JavascriptError *)pSVar10->dwHostSourceContext;
    if (error == (JavascriptError *)&DAT_ffffffffffffffff) {
      walker.currentFrame.stackCheckCodeHeight = 0;
      JavascriptStackWalker::JavascriptStackWalker
                ((JavascriptStackWalker *)&error_1,(ScriptContext *)moduleRecordBase,true,(PVOID)0x0
                 ,false);
      JavascriptStackWalker::GetCaller
                ((JavascriptStackWalker *)&error_1,
                 (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
      do {
        BVar3 = JavascriptStackWalker::GetCaller
                          ((JavascriptStackWalker *)&error_1,
                           (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
        if (((BVar3 == 0) || (walker.currentFrame.stackCheckCodeHeight == 0)) ||
           (BVar3 = JavascriptFunction::IsScriptFunction
                              ((JavascriptFunction *)walker.currentFrame.stackCheckCodeHeight),
           BVar3 == 0)) {
          pJVar7 = ScriptContext::GetLibrary((ScriptContext *)moduleRecordBase);
          pJVar8 = JavascriptLibrary::CreateError(pJVar7);
          JavascriptError::SetErrorMessageProperties
                    (pJVar8,-0x7fffbffb,
                     L"Unable to locate active script or module that calls import()",
                     (ScriptContext *)moduleRecordBase);
          function_local =
               (JavascriptFunction *)
               SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                         (false,pJVar8,(ScriptContext *)moduleRecordBase,
                          (SourceTextModuleRecord *)0x0,true);
          bVar2 = true;
          goto LAB_00fac39a;
        }
        specifierString =
             (JavascriptString *)
             JavascriptFunction::GetFunctionBody
                       ((JavascriptFunction *)walker.currentFrame.stackCheckCodeHeight);
        error = (JavascriptError *)
                FunctionProxy::GetHostSourceContext((FunctionProxy *)specifierString);
        bVar2 = ParseableFunctionInfo::IsES6ModuleCode((ParseableFunctionInfo *)specifierString);
        local_29a = !bVar2 && error == (JavascriptError *)&DAT_ffffffffffffffff;
      } while (local_29a);
      bVar2 = false;
LAB_00fac39a:
      JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&error_1);
      if (bVar2) {
        return function_local;
      }
    }
  }
  iVar4 = (*(pJVar5->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  string = (char16_t *)CONCAT44(extraout_var,iVar4);
  bVar2 = ParseableFunctionInfo::IsES6ModuleCode((ParseableFunctionInfo *)specifierString);
  if (bVar2) {
    this = FunctionProxy::GetScriptContext((FunctionProxy *)specifierString);
    pJVar7 = ScriptContext::GetLibrary(this);
    moduleId = FunctionBody::GetModuleID((FunctionBody *)specifierString);
    pSVar15 = JavascriptLibrary::GetModuleRecord(pJVar7,moduleId);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,
               (ScriptContext *)moduleRecordBase,&stack0xfffffffffffffff8);
    pTVar12 = ScriptContext::GetThreadContext((ScriptContext *)moduleRecordBase);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_190,pTVar12);
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)((long)&__frameAddr_1 + 7),
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pHVar13 = ScriptContext::GetHostScriptContext((ScriptContext *)moduleRecordBase);
    referenceModuleRecord._4_4_ =
         (*pHVar13->_vptr_HostScriptContext[0x12])(pHVar13,pSVar15,string,&moduleRecord);
    AutoHandledExceptionType::~AutoHandledExceptionType
              ((AutoHandledExceptionType *)((long)&__frameAddr_1 + 7));
    if (moduleRecordBase != (ModuleRecordBase *)0x0) {
      pTVar12 = ScriptContext::GetThreadContext((ScriptContext *)moduleRecordBase);
      ThreadContext::DisposeOnLeaveScript(pTVar12);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_190);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  else {
    if (error == (JavascriptError *)&DAT_ffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x284d,
                                  "(dwReferencingSourceContext != Js::Constants::NoHostSourceContext)"
                                  ,
                                  "dwReferencingSourceContext != Js::Constants::NoHostSourceContext"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler_1.m_savedReentrancySafeOrHandled,
               (ScriptContext *)moduleRecordBase,&stack0xfffffffffffffff8);
    pTVar12 = ScriptContext::GetThreadContext((ScriptContext *)moduleRecordBase);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_1d8,pTVar12);
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)((long)&length + 7),
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pHVar13 = ScriptContext::GetHostScriptContext((ScriptContext *)moduleRecordBase);
    referenceModuleRecord._4_4_ =
         (*pHVar13->_vptr_HostScriptContext[0x13])(pHVar13,error,string,&moduleRecord);
    AutoHandledExceptionType::~AutoHandledExceptionType
              ((AutoHandledExceptionType *)((long)&length + 7));
    if (moduleRecordBase != (ModuleRecordBase *)0x0) {
      pTVar12 = ScriptContext::GetThreadContext((ScriptContext *)moduleRecordBase);
      ThreadContext::DisposeOnLeaveScript(pTVar12);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_1d8);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler_1.m_savedReentrancySafeOrHandled);
  }
  if (referenceModuleRecord._4_4_ < 0) {
    allocatedString = (char16 *)PAL_wcslen(string);
    pRVar14 = ScriptContext::GetRecycler((ScriptContext *)moduleRecordBase);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_218,(type_info *)&char16_t::typeinfo,0,(long)allocatedString + 1,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
               ,0x2859);
    pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_218);
    local_1f0 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                          ((Memory *)pRVar14,(Recycler *)Memory::Recycler::AllocLeaf,0,
                           (long)allocatedString + 1);
    wmemcpy_s(local_1f0,(long)allocatedString + 1,string,(size_t)allocatedString);
    local_1f0[(long)allocatedString] = L'\0';
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)moduleRecordBase);
    pJVar8 = JavascriptLibrary::CreateURIError(pJVar7);
    JavascriptError::SetErrorMessageProperties
              (pJVar8,referenceModuleRecord._4_4_,local_1f0,(ScriptContext *)moduleRecordBase);
    function_local =
         (JavascriptFunction *)
         SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                   (false,pJVar8,(ScriptContext *)moduleRecordBase,(SourceTextModuleRecord *)0x0,
                    true);
  }
  else {
    pSVar15 = SourceTextModuleRecord::FromHost(moduleRecord);
    pvVar9 = SourceTextModuleRecord::GetErrorObject(pSVar15);
    if (pvVar9 == (Var)0x0) {
      bVar2 = ModuleRecordBase::WasEvaluated(&pSVar15->super_ModuleRecordBase);
      if (bVar2) {
        iVar4 = (*(pSVar15->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])();
        function_local =
             (JavascriptFunction *)
             SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                       (true,(Var)CONCAT44(extraout_var_00,iVar4),(ScriptContext *)moduleRecordBase,
                        pSVar15,true);
      }
      else {
        function_local =
             (JavascriptFunction *)SourceTextModuleRecord::PostProcessDynamicModuleImport(pSVar15);
      }
    }
    else {
      pvVar9 = SourceTextModuleRecord::GetErrorObject(pSVar15);
      function_local =
           (JavascriptFunction *)
           SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                     (false,pvVar9,(ScriptContext *)moduleRecordBase,pSVar15,true);
    }
  }
  return function_local;
}

Assistant:

Var JavascriptOperators::OP_ImportCall(__in JavascriptFunction *function, __in Var specifier, __in ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ImportCall);
        ModuleRecordBase *moduleRecordBase = nullptr;
        SourceTextModuleRecord *moduleRecord = nullptr;

        FunctionBody* parentFuncBody = function->GetFunctionBody();
        JavascriptString *specifierString = nullptr;

        try
        {
            specifierString = JavascriptConversion::ToString(specifier, scriptContext);
        }
        catch (const JavascriptException &err)
        {
            Var errorObject = err.GetAndClear()->GetThrownObject(scriptContext);
            AssertMsg(errorObject != nullptr, "OP_ImportCall: null error object thrown by ToString(specifier)");
            if (errorObject != nullptr)
            {
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext);
            }

            Throw::InternalError();
        }

        DWORD_PTR dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
        if (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
        {
            // import() called from eval
            if (parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo() == nullptr)
            {
                JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
            }

            dwReferencingSourceContext = parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo()->GetSourceContextInfo()->dwHostSourceContext;

            if (dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
            {
                // Walk the call stack if caller function is neither module code nor having host source context

                JavascriptFunction* caller = nullptr;
                Js::JavascriptStackWalker walker(scriptContext);
                walker.GetCaller(&caller);

                do
                {
                    if (walker.GetCaller(&caller) && caller != nullptr && caller->IsScriptFunction())
                    {
                        parentFuncBody = caller->GetFunctionBody();
                        dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
                    }
                    else
                    {
                        JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                        JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                        return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
                    }

                } while (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext);
            }
        }

        LPCOLESTR moduleName = specifierString->GetSz();
        HRESULT hr = 0;

        if (parentFuncBody->IsES6ModuleCode())
        {
            SourceTextModuleRecord *referenceModuleRecord = parentFuncBody->GetScriptContext()->GetLibrary()->GetModuleRecord(parentFuncBody->GetModuleID());
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModule(referenceModuleRecord, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }
        else
        {
            Assert(dwReferencingSourceContext != Js::Constants::NoHostSourceContext);
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModuleFromScript(dwReferencingSourceContext, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }

        if (FAILED(hr))
        {
            // We cannot just use the buffer in the specifier string - need to make a copy here.
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            Js::JavascriptError *error = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
        }

        moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);

        if (moduleRecord->GetErrorObject() != nullptr)
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, moduleRecord->GetErrorObject(), scriptContext, moduleRecord);
        }
        else if (moduleRecord->WasEvaluated())
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(true, moduleRecord->GetNamespace(), scriptContext, moduleRecord);
        }

        return moduleRecord->PostProcessDynamicModuleImport();
        JIT_HELPER_END(ImportCall);
    }